

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SeekHead::AddSeekEntry(SeekHead *this,uint32_t id,uint64_t pos)

{
  int local_2c;
  int32_t i;
  uint64_t pos_local;
  uint32_t id_local;
  SeekHead *this_local;
  
  local_2c = 0;
  while( true ) {
    if (4 < local_2c) {
      return false;
    }
    if (this->seek_entry_id_[local_2c] == 0) break;
    local_2c = local_2c + 1;
  }
  this->seek_entry_id_[local_2c] = id;
  this->seek_entry_pos_[local_2c] = pos;
  return true;
}

Assistant:

bool SeekHead::AddSeekEntry(uint32_t id, uint64_t pos) {
  for (int32_t i = 0; i < kSeekEntryCount; ++i) {
    if (seek_entry_id_[i] == 0) {
      seek_entry_id_[i] = id;
      seek_entry_pos_[i] = pos;
      return true;
    }
  }
  return false;
}